

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_parse_sign(string *text,bool *negative_ptr)

{
  bool *pbVar1;
  char *pcVar2;
  long lVar3;
  bool bVar4;
  string local_50 [32];
  char *local_30;
  char *end;
  char *start;
  bool *negative_ptr_local;
  string *text_local;
  
  start = negative_ptr;
  negative_ptr_local = (bool *)text;
  pcVar2 = (char *)std::__cxx11::string::data();
  end = pcVar2;
  lVar3 = std::__cxx11::string::size();
  pbVar1 = negative_ptr_local;
  local_30 = pcVar2 + lVar3;
  while( true ) {
    bVar4 = false;
    if (end < local_30) {
      bVar4 = *end == ' ';
    }
    if (!bVar4) break;
    end = end + 1;
  }
  while( true ) {
    bVar4 = false;
    if (end < local_30) {
      bVar4 = local_30[-1] == ' ';
    }
    if (!bVar4) break;
    local_30 = local_30 + -1;
  }
  if (end < local_30) {
    *start = *end == '-';
    if ((((*start & 1U) == 0) && (*end != '+')) || (end = end + 1, end < local_30)) {
      std::__cxx11::string::data();
      std::__cxx11::string::substr((ulong)local_50,(ulong)pbVar1);
      std::__cxx11::string::operator=((string *)negative_ptr_local,local_50);
      std::__cxx11::string::~string(local_50);
      text_local._7_1_ = true;
    }
    else {
      text_local._7_1_ = false;
    }
  }
  else {
    text_local._7_1_ = false;
  }
  return text_local._7_1_;
}

Assistant:

inline bool safe_parse_sign(string* text  /*inout*/,
                            bool* negative_ptr  /*output*/) {
  const char* start = text->data();
  const char* end = start + text->size();

  // Consume whitespace.
  while (start < end && (start[0] == ' ')) {
    ++start;
  }
  while (start < end && (end[-1] == ' ')) {
    --end;
  }
  if (start >= end) {
    return false;
  }

  // Consume sign.
  *negative_ptr = (start[0] == '-');
  if (*negative_ptr || start[0] == '+') {
    ++start;
    if (start >= end) {
      return false;
    }
  }
  *text = text->substr(start - text->data(), end - start);
  return true;
}